

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::Vector::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Vector *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Vector *local_18;
  Vector *this_local;
  
  local_18 = this;
  this_local = (Vector *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"X: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32X);
  poVar1 = std::operator<<(poVar1,",  Y: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Y);
  poVar1 = std::operator<<(poVar1,",  Z: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Z);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Vector::GetAsString() const
{
    KStringStream ss;

    ss << "X: "    << m_f32X
       << ",  Y: " << m_f32Y
       << ",  Z: " << m_f32Z << "\n";

    return ss.str();
}